

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

int cargo_add_option(cargo_t ctx,cargo_option_flags_t flags,char *optnames,char *description,
                    char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_d8;
  undefined1 local_b8 [40];
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_90 = in_R9;
  if (ctx != (cargo_t)0x0) {
    local_d8.reg_save_area = local_b8;
    local_d8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_d8.gp_offset = 0x28;
    local_d8.fp_offset = 0x30;
    iVar1 = cargo_add_optionv(ctx,flags,optnames,description,fmt,&local_d8);
    return iVar1;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x18f7,
                "int cargo_add_option(cargo_t, cargo_option_flags_t, const char *, const char *, const char *, ...)"
               );
}

Assistant:

int cargo_add_option(cargo_t ctx, cargo_option_flags_t flags,
                        const char *optnames, const char *description,
                        const char *fmt, ...)
{
    int ret;
    va_list ap;
    assert(ctx);

    va_start(ap, fmt);
    ret = cargo_add_optionv(ctx, flags, optnames, description, fmt, ap);
    va_end(ap);

    return ret;
}